

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.cxx
# Opt level: O3

int __thiscall Fl_Valuator::format(Fl_Valuator *this,char *buffer)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  char temp [32];
  char local_38 [40];
  
  dVar1 = this->value_;
  dVar2 = this->A;
  if (((dVar2 == 0.0) && (!NAN(dVar2))) || (this->B == 0)) {
    iVar4 = snprintf(buffer,0x80,"%g",dVar1);
    return iVar4;
  }
  snprintf(local_38,0x20,"%.12f",dVar2 / (double)this->B);
  sVar5 = strlen(local_38);
  uVar6 = sVar5 & 0xffffffff;
  do {
    uVar6 = uVar6 - 1;
    if ((int)sVar5 < 2) {
      uVar6 = 0;
      goto LAB_001dc0d7;
    }
    uVar3 = (int)sVar5 - 1;
    sVar5 = (size_t)uVar3;
  } while (local_38[uVar6 & 0xffffffff] == '0');
  uVar7 = 1;
  if (1 < (int)uVar3) {
    uVar7 = uVar3;
  }
  uVar6 = 0;
  do {
    if (9 < (int)local_38[sVar5] - 0x30U) goto LAB_001dc0d7;
    sVar5 = (size_t)((int)sVar5 - 1);
    uVar3 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar3;
  } while (uVar7 != uVar3);
  uVar6 = (ulong)uVar7;
LAB_001dc0d7:
  iVar4 = snprintf(buffer,0x80,"%.*f",dVar1,uVar6);
  return iVar4;
}

Assistant:

int Fl_Valuator::format(char* buffer) {
  double v = value();
  // MRS: THIS IS A HACK - RECOMMEND ADDING BUFFER SIZE ARGUMENT
  if (!A || !B) return snprintf(buffer, 128, "%g", v);

  // Figure out how many digits are required to correctly format the
  // value.
  int i, c = 0;
  char temp[32];
  // output a number with many digits after the decimal point. This
  // seems to be needed to get high precission
  snprintf(temp, sizeof(temp), "%.12f", A/B);
  // strip all trailing 0's
  for (i=(int) strlen(temp)-1; i>0; i--) {
    if (temp[i]!='0') break;
  }
  // count digits until we find the decimal point (or comma or whatever
  // letter is set in the current locale)
  for (; i>0; i--, c++) {
    if (!isdigit(temp[i])) break;
  }

  // MRS: THIS IS A HACK - RECOMMEND ADDING BUFFER SIZE ARGUMENT
  return snprintf(buffer, 128, "%.*f", c, v);
}